

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

bool port_is_enabled(Port *port,char *loc,size_t loc_size,Ports *base,void *runtime,
                    bool relative_to_parent,port_walker_t walker,void *data)

{
  char cVar1;
  long lVar2;
  Port *pPVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  bool bVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  Ports *this;
  byte bVar15;
  char *pcVar16;
  char *dest;
  char acStack_b0 [8];
  size_t sStack_a8;
  long lStack_a0;
  char acStack_98 [8];
  char acStack_90 [16];
  MetaContainer local_80;
  rtosc_arg_val_t rval;
  
  bVar8 = true;
  if (runtime != (void *)0x0 && port != (Port *)0x0) {
    pcVar14 = port->metadata;
    if ((pcVar14 != (char *)0x0) && (*pcVar14 == ':')) {
      pcVar14 = pcVar14 + 1;
    }
    builtin_strncpy(acStack_90,"Y_\x10",4);
    acStack_90[4] = '\0';
    acStack_90[5] = '\0';
    acStack_90[6] = '\0';
    acStack_90[7] = '\0';
    rtosc::Port::MetaContainer::MetaContainer(&local_80,pcVar14);
    builtin_strncpy(acStack_90,"o_\x10",4);
    acStack_90[4] = '\0';
    acStack_90[5] = '\0';
    acStack_90[6] = '\0';
    acStack_90[7] = '\0';
    pcVar14 = rtosc::Port::MetaContainer::operator[](&local_80,"enabled by");
    if (pcVar14 != (char *)0x0) {
      pcVar16 = port->name;
      cVar7 = *pcVar16;
      bVar15 = 1;
      pcVar5 = pcVar14;
      this = base;
      if (cVar7 != '\0') {
        lVar2 = 0;
        do {
          cVar1 = pcVar14[lVar2];
          if (((cVar1 == '/') || (cVar7 == '/')) || (cVar7 != cVar1)) {
            if (cVar7 == '/' && cVar1 == '/') {
              acStack_90[0] = -0x2a;
              acStack_90[1] = '_';
              acStack_90[2] = '\x10';
              acStack_90[3] = '\0';
              acStack_90[4] = '\0';
              acStack_90[5] = '\0';
              acStack_90[6] = '\0';
              acStack_90[7] = '\0';
              pPVar3 = rtosc::Ports::operator[](base,pcVar16);
              bVar15 = 0;
              pcVar5 = pcVar14 + lVar2 + 1;
              this = pPVar3->ports;
            }
            break;
          }
          cVar7 = pcVar16[lVar2 + 1];
          lVar2 = lVar2 + 1;
        } while (cVar7 != '\0');
      }
      acStack_90[0] = -0x17;
      acStack_90[1] = '_';
      acStack_90[2] = '\x10';
      acStack_90[3] = '\0';
      acStack_90[4] = '\0';
      acStack_90[5] = '\0';
      acStack_90[6] = '\0';
      acStack_90[7] = '\0';
      pPVar3 = rtosc::Ports::operator[](this,pcVar5);
      acStack_90[0] = -0xb;
      acStack_90[1] = '_';
      acStack_90[2] = '\x10';
      acStack_90[3] = '\0';
      acStack_90[4] = '\0';
      acStack_90[5] = '\0';
      acStack_90[6] = '\0';
      acStack_90[7] = '\0';
      sVar4 = strlen(loc);
      lVar2 = -(loc_size + 0xf & 0xfffffffffffffff0);
      pcVar16 = acStack_90 + lVar2 + 8;
      pcVar10 = acStack_90 + lVar2;
      rval.val.b.data = (uint8_t *)(acStack_90 + 8);
      builtin_strncpy(acStack_90 + lVar2,"\x19`\x10",4);
      pcVar10[4] = '\0';
      pcVar10[5] = '\0';
      pcVar10[6] = '\0';
      pcVar10[7] = '\0';
      strcpy(pcVar16,loc);
      uVar9 = (ulong)(int)sVar4;
      if (relative_to_parent) {
        pcVar11 = acStack_90 + lVar2;
        builtin_strncpy(acStack_90 + lVar2,":`\x10",4);
        pcVar11[4] = '\0';
        pcVar11[5] = '\0';
        pcVar11[6] = '\0';
        pcVar11[7] = '\0';
        strncat(pcVar16,"../",~uVar9 + loc_size);
      }
      pcVar12 = acStack_90 + lVar2;
      builtin_strncpy(acStack_90 + lVar2,"W`\x10",4);
      pcVar12[4] = '\0';
      pcVar12[5] = '\0';
      pcVar12[6] = '\0';
      pcVar12[7] = '\0';
      strncat(pcVar16,pcVar14,(loc_size - uVar9) - 4);
      pcVar13 = acStack_90 + lVar2;
      builtin_strncpy(acStack_90 + lVar2,"_`\x10",4);
      pcVar13[4] = '\0';
      pcVar13[5] = '\0';
      pcVar13[6] = '\0';
      pcVar13[7] = '\0';
      pcVar5 = rtosc::Ports::collapsePath(pcVar16);
      dest = pcVar16 + -((ulong)(pcVar16 + (loc_size - (long)pcVar5) + 0xf) & 0xfffffffffffffff0);
      dest[-8] = -0x73;
      dest[-7] = '`';
      dest[-6] = '\x10';
      dest[-5] = '\0';
      dest[-4] = '\0';
      dest[-3] = '\0';
      dest[-2] = '\0';
      dest[-1] = '\0';
      pcVar6 = strrchr(pcVar5,0x2f);
      pcVar14 = pcVar6 + 1;
      if (pcVar6 == (char *)0x0) {
        pcVar14 = pcVar5;
      }
      dest[-8] = -0x5d;
      dest[-7] = '`';
      dest[-6] = '\x10';
      dest[-5] = '\0';
      dest[-4] = '\0';
      dest[-3] = '\0';
      dest[-2] = '\0';
      dest[-1] = '\0';
      fast_strcpy(dest,pcVar14,(size_t)(pcVar16 + (loc_size - (long)pcVar5)));
      dest[-0x10] = '\0';
      dest[-0xf] = '\0';
      dest[-0xe] = '\0';
      dest[-0xd] = '\0';
      dest[-0xc] = '\0';
      dest[-0xb] = '\0';
      dest[-10] = '\0';
      dest[-9] = '\0';
      *(MetaContainer **)(dest + -0x18) = &local_80;
      dest[-0x20] = '\x01';
      dest[-0x1f] = '\0';
      dest[-0x1e] = '\0';
      dest[-0x1d] = '\0';
      dest[-0x1c] = '\0';
      dest[-0x1b] = '\0';
      dest[-0x1a] = '\0';
      dest[-0x19] = '\0';
      dest[-0x28] = -0x31;
      dest[-0x27] = '`';
      dest[-0x26] = '\x10';
      dest[-0x25] = '\0';
      dest[-0x24] = '\0';
      dest[-0x23] = '\0';
      dest[-0x22] = '\0';
      dest[-0x21] = '\0';
      rtosc::helpers::get_value_from_runtime
                (runtime,pPVar3,(size_t)(pcVar16 + (loc_size - (long)pcVar5)),pcVar5,dest,0x2000,
                 *(size_t *)(dest + -0x20),*(rtosc_arg_val_t **)(dest + -0x18),
                 *(vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   **)(dest + -0x10));
      bVar8 = true;
      if (((char)local_80.str_ptr != 'T') &&
         (bVar8 = rval._0_4_ != 0 && (char)local_80.str_ptr == 'i',
         ((bVar15 & relative_to_parent) == 0 && walker != (port_walker_t)0x0) &&
         (rval._0_4_ == 0 || (char)local_80.str_ptr != 'i'))) {
        builtin_strncpy(acStack_90 +
                        -((ulong)(pcVar16 + (loc_size - (long)pcVar5) + 0xf) & 0xfffffffffffffff0) +
                        lVar2," a\x10",4);
        dest[-4] = '\0';
        dest[-3] = '\0';
        dest[-2] = '\0';
        dest[-1] = '\0';
        (*walker)(pPVar3,pcVar5,pcVar16 + uVar9 + 3,base,data,runtime);
        bVar8 = false;
      }
    }
  }
  return bVar8;
}

Assistant:

bool port_is_enabled(const Port* port, char* loc, size_t loc_size,
                     const Ports& base, void *runtime,
                     bool relative_to_parent,
                     port_walker_t walker, void* data)
{
    // TODO: this code should be improved
    if(port && runtime)
    {
        const char* enable_port = port->meta()["enabled by"];
        if(enable_port)
        {
            /*
                find out which Ports object to dispatch at
                (the current one or its child?)
             */
            const char* n = port->name;
            const char* e = enable_port;
            for( ; *n && (*n == *e) && *n != '/' && *e != '/'; ++n, ++e) ;

            bool subport = (*e == '/' && *n == '/');

            const char* ask_port_str = subport
                                       ? e+1
                                       : enable_port;

            const Ports& ask_ports = subport ? *base[port->name]->ports
                                             : base;

            assert(!strchr(ask_port_str, '/'));
            const Port* ask_port = ask_ports[ask_port_str];
            assert(ask_port);

            rtosc_arg_val_t rval;

            /*
                concatenate the location string
             */
            int loclen = strlen(loc);
            STACKALLOC(char, loc_copy, loc_size);
            strcpy(loc_copy, loc); // TODO: clang says strcpy is insecure
            if(relative_to_parent)
                strncat(loc_copy, "../", loc_size - loclen - 1);
            strncat(loc_copy, enable_port, loc_size - loclen - 3 - 1);

            char* collapsed_loc = Ports::collapsePath(loc_copy);
            loc_size -= (collapsed_loc - loc_copy);

            /*
                receive the "enabled" property
             */
            STACKALLOC(char, buf, loc_size);
            // TODO: pass a parameter portname_from_base, since Ports might
            //       also be of type a#N/b
            const char* last_slash = strrchr(collapsed_loc, '/');
            fast_strcpy(buf, last_slash ? last_slash + 1 : collapsed_loc,
                        loc_size); // TODO: bug: VoicePar#8/Enabled

            helpers::get_value_from_runtime(runtime,
                *ask_port, loc_size, collapsed_loc, buf,
                8192, 1, &rval, nullptr);
            assert(rval.type == 'T' || rval.type == 'F' || rval.type == 'i');

            bool res = rval.type == 'T' || (rval.type == 'i' && rval.val.i != 0);
            /*
             * If called from walk_ports, an enabling port must always be
             * traversed. However, if such a port resides inside a the port
             * which it currently disables, walk_ports would normally *not*
             * traverse it. So this allows still running walk_ports.
             */
            if (walker && !res && (subport || !relative_to_parent)) {
                // this makes some assumptions on how Ports::collapsePath works:
                // it starts at the end and keeps the string unchanged until the
                // first ".." - so we get:
                //    <loclen><4->
                //    /loc/abc/../enable
                //            abc/enable
                //
                const char* old_end = loc_copy + loclen + 3;
                walker(ask_port, collapsed_loc, old_end, base, data, runtime);
            }

            return res;
        }
        else // Port has no "enabled" property, so it is always enabled
            return true;
    }
    else // no runtime provided, so run statically through all subports
        return true;
}